

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  TRef TVar2;
  GCfunc *fn;
  uint *puVar3;
  long lVar4;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  ptrdiff_t i;
  TRef *fbase;
  TValue *functv;
  RecordIndex ix;
  TraceError in_stack_ffffffffffffff6c;
  jit_State *J_00;
  jit_State *in_stack_ffffffffffffff88;
  GCfunc local_60;
  uint local_38;
  long local_30;
  uint local_24;
  long local_20;
  GCfunc *local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  fn = (GCfunc *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x10) + (ulong)in_ESI * 8);
  puVar3 = (uint *)(*(long *)(in_RDI + 0x80) + (ulong)in_ESI * 4);
  local_30 = in_RDX;
  local_24 = in_ESI;
  local_20 = in_RDI;
  for (J_00 = (jit_State *)0x0; (long)J_00 <= local_30;
      J_00 = (jit_State *)((long)&(J_00->cur).nextgc.gcptr32 + 1)) {
    if (*(int *)(*(long *)(local_20 + 0x80) +
                ((long)&(J_00->cur).nextgc.gcptr32 + (ulong)local_24) * 4) == 0) {
      sload(J_00,in_stack_ffffffffffffff6c);
    }
  }
  if ((*puVar3 & 0x1f000000) != 0x8000000) {
    local_60._24_4_ = *puVar3;
    local_8 = *(undefined8 *)(local_20 + 0x60);
    local_10 = &stack0xffffffffffffff88;
    in_stack_ffffffffffffff88 = *(jit_State **)fn;
    local_18 = fn;
    iVar1 = lj_record_mm_lookup((jit_State *)ix.keyv,(RecordIndex *)ix.tabv,functv._4_4_);
    if ((iVar1 == 0) || ((local_38 & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J_00,in_stack_ffffffffffffff6c);
    }
    local_30 = local_30 + 1;
    for (lVar4 = local_30; 0 < lVar4; lVar4 = lVar4 + -1) {
      puVar3[lVar4] = puVar3[lVar4 + -1];
    }
    *puVar3 = local_38;
    fn = &local_60;
  }
  TVar2 = rec_call_specialize(in_stack_ffffffffffffff88,fn,(TRef)((ulong)puVar3 >> 0x20));
  *puVar3 = TVar2 | 0x10000;
  *(int *)(local_20 + 0x8c) = (int)local_30;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef *fbase = &J->base[func];
  ptrdiff_t i;
  for (i = 0; i <= nargs; i++)
    (void)getslot(J, func+i);  /* Ensure func and all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > 0; i--)  /* Shift arguments up. */
      fbase[i] = fbase[i-1];
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  fbase[0] = TREF_FRAME | rec_call_specialize(J, funcV(functv), fbase[0]);
  J->maxslot = (BCReg)nargs;
}